

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<long>::test_small_numerators<(libdivide::Branching)0>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)0> *the_divider)

{
  long numer;
  int32_t i;
  long numer_00;
  
  numer = 0;
  numer_00 = 0;
  do {
    test_one<(libdivide::Branching)0>(this,numer_00,denom,the_divider);
    test_one<(libdivide::Branching)0>(this,numer,denom,the_divider);
    numer_00 = numer_00 + 1;
    numer = numer + -1;
  } while (numer_00 != 0x4000);
  return;
}

Assistant:

void test_small_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test small numerators < 2^16
        // balance signed & unsigned testing
#if defined(__AVR__)
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 7 : (uint32_t)1 << 8;
#else
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 14 : (uint32_t)1 << 16;
#endif
        for (int32_t i = 0; i < small_stop; ++i) {
            test_one((T)i, denom, the_divider);

            if (limits::is_signed) {
                test_one((T)-i, denom, the_divider);
            }
        }
    }